

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_image<unsigned_char,unsigned_char>
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int c0,CImg<unsigned_char> *sprite,
          CImg<unsigned_char> *mask,float opacity,float mask_max_value)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uchar *puVar12;
  CImgArgumentException *this_00;
  CImg<unsigned_char> *pCVar13;
  float extraout_XMM0_Da;
  type tVar14;
  uint local_29c;
  uint local_294;
  uint local_28c;
  uint local_284;
  int local_268;
  int local_258;
  int local_24c;
  int local_244;
  uint local_240;
  int local_230;
  uint local_220;
  int local_210;
  int local_200;
  int local_1f0;
  int local_1e0;
  int local_1d0;
  int local_138;
  float local_134;
  float local_130;
  float copacity;
  float nopacity;
  float mopacity;
  int x;
  int y;
  int z;
  int c;
  uchar *ptrd;
  unsigned_long soffZ;
  unsigned_long offZ;
  unsigned_long soffY;
  unsigned_long offY;
  unsigned_long soffX;
  unsigned_long offX;
  uchar *ptrm;
  uchar *ptrs;
  int local_c8;
  int ssize;
  int coff;
  int lC;
  int lZ;
  int lY;
  int lX;
  bool bc;
  bool bz;
  bool by;
  bool bx;
  CImg<unsigned_char> local_80;
  float local_60;
  float local_5c;
  float mask_max_value_local;
  float opacity_local;
  CImg<unsigned_char> *sprite_local;
  int c0_local;
  int z0_local;
  int y0_local;
  int x0_local;
  CImg<unsigned_char> *this_local;
  
  local_60 = mask_max_value;
  local_5c = opacity;
  _mask_max_value_local = sprite;
  sprite_local._0_4_ = c0;
  sprite_local._4_4_ = z0;
  c0_local = y0;
  z0_local = x0;
  _y0_local = this;
  bVar6 = is_empty(this);
  this_local = this;
  if (((!bVar6) &&
      (puVar12 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)_mask_max_value_local),
      puVar12 != (uchar *)0x0)) &&
     (puVar12 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)mask),
     puVar12 != (uchar *)0x0)) {
    bVar6 = is_overlapped<unsigned_char>(this,_mask_max_value_local);
    iVar11 = z0_local;
    iVar10 = c0_local;
    uVar2 = sprite_local._4_4_;
    uVar1 = (uint)sprite_local;
    if (bVar6) {
      operator+(&local_80,_mask_max_value_local);
      this_local = draw_image<unsigned_char,unsigned_char>
                             (this,iVar11,iVar10,uVar2,uVar1,&local_80,mask,local_5c,local_60);
      ~CImg(&local_80);
    }
    else {
      bVar6 = is_overlapped<unsigned_char>(this,mask);
      iVar11 = z0_local;
      iVar10 = c0_local;
      uVar2 = sprite_local._4_4_;
      uVar1 = (uint)sprite_local;
      pCVar13 = _mask_max_value_local;
      if (bVar6) {
        operator+((CImg<unsigned_char> *)&lX,mask);
        this_local = draw_image<unsigned_char,unsigned_char>
                               (this,iVar11,iVar10,uVar2,uVar1,pCVar13,(CImg<unsigned_char> *)&lX,
                                local_5c,local_60);
        ~CImg((CImg<unsigned_char> *)&lX);
      }
      else {
        if (((mask->_width != _mask_max_value_local->_width) ||
            (mask->_height != _mask_max_value_local->_height)) ||
           (mask->_depth != _mask_max_value_local->_depth)) {
          this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
          uVar1 = this->_width;
          uVar2 = this->_height;
          uVar3 = this->_depth;
          uVar4 = this->_spectrum;
          pixel_type();
          CImgArgumentException::CImgArgumentException
                    (this_00,
                     "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::draw_image(): Sprite (%u,%u,%u,%u,%p) and mask (%u,%u,%u,%u,%p) have incompatible dimensions."
                     ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
          __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                      CImgArgumentException::~CImgArgumentException);
        }
        lY._3_1_ = z0_local < 0;
        lY._2_1_ = c0_local < 0;
        lY._1_1_ = (int)sprite_local._4_4_ < 0;
        lY._0_1_ = (int)(uint)sprite_local < 0;
        iVar7 = width(_mask_max_value_local);
        iVar10 = z0_local;
        iVar8 = width(_mask_max_value_local);
        iVar9 = width(this);
        iVar11 = z0_local;
        if (iVar9 < iVar10 + iVar8) {
          iVar10 = width(_mask_max_value_local);
          local_1d0 = width(this);
          local_1d0 = (iVar11 + iVar10) - local_1d0;
        }
        else {
          local_1d0 = 0;
        }
        if ((lY._3_1_ & 1) == 0) {
          local_1e0 = 0;
        }
        else {
          local_1e0 = z0_local;
        }
        lZ = (iVar7 - local_1d0) + local_1e0;
        iVar7 = height(_mask_max_value_local);
        iVar10 = c0_local;
        iVar8 = height(_mask_max_value_local);
        iVar9 = height(this);
        iVar11 = c0_local;
        if (iVar9 < iVar10 + iVar8) {
          iVar10 = height(_mask_max_value_local);
          local_1f0 = height(this);
          local_1f0 = (iVar11 + iVar10) - local_1f0;
        }
        else {
          local_1f0 = 0;
        }
        if ((lY._2_1_ & 1) == 0) {
          local_200 = 0;
        }
        else {
          local_200 = c0_local;
        }
        lC = (iVar7 - local_1f0) + local_200;
        iVar10 = depth(_mask_max_value_local);
        uVar1 = sprite_local._4_4_;
        iVar11 = depth(_mask_max_value_local);
        iVar7 = depth(this);
        uVar2 = sprite_local._4_4_;
        if (iVar7 < (int)(uVar1 + iVar11)) {
          iVar11 = depth(_mask_max_value_local);
          local_210 = depth(this);
          local_210 = (uVar2 + iVar11) - local_210;
        }
        else {
          local_210 = 0;
        }
        if ((lY._1_1_ & 1) == 0) {
          local_220 = 0;
        }
        else {
          local_220 = sprite_local._4_4_;
        }
        coff = (iVar10 - local_210) + local_220;
        iVar10 = spectrum(_mask_max_value_local);
        uVar1 = (uint)sprite_local;
        iVar11 = spectrum(_mask_max_value_local);
        iVar7 = spectrum(this);
        uVar2 = (uint)sprite_local;
        if (iVar7 < (int)(uVar1 + iVar11)) {
          iVar11 = spectrum(_mask_max_value_local);
          local_230 = spectrum(this);
          local_230 = (uVar2 + iVar11) - local_230;
        }
        else {
          local_230 = 0;
        }
        local_24c = c0_local;
        if (((byte)lY & 1) == 0) {
          local_240 = 0;
        }
        else {
          local_240 = (uint)sprite_local;
        }
        ssize = (iVar10 - local_230) + local_240;
        if ((lY._3_1_ & 1) == 0) {
          local_244 = 0;
        }
        else {
          local_244 = z0_local;
        }
        if ((lY._2_1_ & 1) == 0) {
          local_24c = 0;
        }
        else {
          iVar10 = width(mask);
          local_24c = local_24c * iVar10;
        }
        uVar1 = sprite_local._4_4_;
        if ((lY._1_1_ & 1) == 0) {
          local_258 = 0;
        }
        else {
          iVar10 = width(mask);
          local_258 = height(mask);
          local_258 = uVar1 * iVar10 * local_258;
        }
        uVar1 = (uint)sprite_local;
        if (((byte)lY & 1) == 0) {
          local_268 = 0;
        }
        else {
          iVar10 = width(mask);
          iVar11 = height(mask);
          local_268 = depth(mask);
          local_268 = uVar1 * iVar10 * iVar11 * local_268;
        }
        local_c8 = ((-local_24c - local_244) - local_258) - local_268;
        iVar10 = width(mask);
        iVar11 = height(mask);
        iVar7 = depth(mask);
        iVar8 = spectrum(mask);
        ptrs._4_4_ = iVar10 * iVar11 * iVar7 * iVar8;
        ptrm = _mask_max_value_local->_data + local_c8;
        offX = (unsigned_long)(mask->_data + local_c8);
        soffX = (ulong)this->_width - (long)lZ;
        offY = (ulong)_mask_max_value_local->_width - (long)lZ;
        soffY = (ulong)this->_width * (ulong)(this->_height - lC);
        offZ = (ulong)_mask_max_value_local->_width * (ulong)(_mask_max_value_local->_height - lC);
        soffZ = (ulong)this->_width * (ulong)this->_height * (ulong)(this->_depth - coff);
        ptrd = (uchar *)((ulong)_mask_max_value_local->_width *
                         (ulong)_mask_max_value_local->_height *
                        (ulong)(_mask_max_value_local->_depth - coff));
        if (((0 < lZ) && (0 < lC)) && ((0 < coff && (0 < ssize)))) {
          if (z0_local < 0) {
            local_284 = 0;
          }
          else {
            local_284 = z0_local;
          }
          if (c0_local < 0) {
            local_28c = 0;
          }
          else {
            local_28c = c0_local;
          }
          if ((int)sprite_local._4_4_ < 0) {
            local_294 = 0;
          }
          else {
            local_294 = sprite_local._4_4_;
          }
          if ((int)(uint)sprite_local < 0) {
            local_29c = 0;
          }
          else {
            local_29c = (uint)sprite_local;
          }
          pCVar13 = this;
          _z = data(this,local_284,local_28c,local_294,local_29c);
          for (y = 0; y < ssize; y = y + 1) {
            offX = (unsigned_long)
                   (mask->_data + (long)(offX - (long)mask->_data) % (long)ptrs._4_4_);
            for (x = 0; x < coff; x = x + 1) {
              for (mopacity = 0.0; (int)mopacity < lC; mopacity = (float)((int)mopacity + 1)) {
                for (nopacity = 0.0; (int)nopacity < lZ; nopacity = (float)((int)nopacity + 1)) {
                  copacity = (float)*(byte *)offX * local_5c;
                  offX = offX + 1;
                  cimg::abs((int)pCVar13);
                  fVar5 = local_60;
                  local_138 = 0;
                  pCVar13 = (CImg<unsigned_char> *)&copacity;
                  local_130 = extraout_XMM0_Da;
                  tVar14 = cimg::max<float,int>((float *)pCVar13,&local_138);
                  local_134 = fVar5 - tVar14;
                  *_z = (byte)(int)((local_130 * (float)*ptrm + (float)*_z * local_134) / local_60);
                  _z = _z + 1;
                  ptrm = ptrm + 1;
                }
                _z = _z + soffX;
                ptrm = ptrm + offY;
                offX = offY + offX;
              }
              _z = _z + soffY;
              ptrm = ptrm + offZ;
              offX = offZ + offX;
            }
            _z = _z + soffZ;
            ptrm = ptrd + (long)ptrm;
            offX = (unsigned_long)(ptrd + offX);
          }
        }
      }
    }
  }
  return this_local;
}

Assistant:

CImg<T>& draw_image(const int x0, const int y0, const int z0, const int c0,
                        const CImg<ti>& sprite, const CImg<tm>& mask, const float opacity=1,
                        const float mask_max_value=1) {
      if (is_empty() || !sprite || !mask) return *this;
      if (is_overlapped(sprite)) return draw_image(x0,y0,z0,c0,+sprite,mask,opacity,mask_max_value);
      if (is_overlapped(mask))   return draw_image(x0,y0,z0,c0,sprite,+mask,opacity,mask_max_value);
      if (mask._width!=sprite._width || mask._height!=sprite._height || mask._depth!=sprite._depth)
        throw CImgArgumentException(_cimg_instance
                                    "draw_image(): Sprite (%u,%u,%u,%u,%p) and mask (%u,%u,%u,%u,%p) have incompatible dimensions.",
                                    cimg_instance,
                                    sprite._width,sprite._height,sprite._depth,sprite._spectrum,sprite._data,
                                    mask._width,mask._height,mask._depth,mask._spectrum,mask._data);

      const bool bx = (x0<0), by = (y0<0), bz = (z0<0), bc = (c0<0);
      const int
        lX = sprite.width() - (x0 + sprite.width()>width()?x0 + sprite.width() - width():0) + (bx?x0:0),
        lY = sprite.height() - (y0 + sprite.height()>height()?y0 + sprite.height() - height():0) + (by?y0:0),
        lZ = sprite.depth() - (z0 + sprite.depth()>depth()?z0 + sprite.depth() - depth():0) + (bz?z0:0),
        lC = sprite.spectrum() - (c0 + sprite.spectrum()>spectrum()?c0 + sprite.spectrum() - spectrum():0) + (bc?c0:0);
      const int
        coff = -(bx?x0:0)-(by?y0*mask.width():0)-(bz?z0*mask.width()*mask.height():0)-(bc?c0*mask.width()*mask.height()*mask.depth():0),
        ssize = mask.width()*mask.height()*mask.depth()*mask.spectrum();
      const ti *ptrs = sprite._data + coff;
      const tm *ptrm = mask._data   + coff;
      const unsigned long
        offX = (unsigned long)_width - lX,
        soffX = (unsigned long)sprite._width - lX,
        offY = (unsigned long)_width*(_height - lY),
        soffY = (unsigned long)sprite._width*(sprite._height - lY),
        offZ = (unsigned long)_width*_height*(_depth - lZ),
        soffZ = (unsigned long)sprite._width*sprite._height*(sprite._depth - lZ);
      if (lX>0 && lY>0 && lZ>0 && lC>0) {
	T *ptrd = data(x0<0?0:x0,y0<0?0:y0,z0<0?0:z0,c0<0?0:c0);
        for (int c = 0; c<lC; ++c) {
          ptrm = mask._data + (ptrm - mask._data)%ssize;
          for (int z = 0; z<lZ; ++z) {
            for (int y = 0; y<lY; ++y) {
              for (int x = 0; x<lX; ++x) {
                const float mopacity = (float)(*(ptrm++)*opacity),
                  nopacity = cimg::abs(mopacity), copacity = mask_max_value - cimg::max(mopacity,0);
                *ptrd = (T)((nopacity*(*(ptrs++)) + *ptrd*copacity)/mask_max_value);
                ++ptrd;
              }
              ptrd+=offX; ptrs+=soffX; ptrm+=soffX;
            }
            ptrd+=offY; ptrs+=soffY; ptrm+=soffY;
          }
          ptrd+=offZ; ptrs+=soffZ; ptrm+=soffZ;
        }
      }
      return *this;
    }